

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbc.c
# Opt level: O3

Abc_Ntk_t * Wlc_NtkGetInv(Wlc_Ntk_t *pNtk,Vec_Int_t *vInv,Vec_Str_t *vSop,int fVerbose)

{
  Wlc_Obj_t *pWVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  Abc_Obj_t *pObj;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  char Buffer [5000];
  char local_13b8 [5000];
  
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  pcVar3 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pName = pcVar3;
  iVar2 = (pNtk->vCis).nSize;
  if (iVar2 < 1) {
    iVar13 = 0;
  }
  else {
    lVar12 = 0;
    uVar9 = 0;
    do {
      iVar13 = (pNtk->vCis).pArray[lVar12];
      lVar7 = (long)iVar13;
      if ((lVar7 < 1) || (pNtk->nObjsAlloc <= iVar13)) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlc.h"
                      ,0xa9,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar1 = pNtk->pObjs;
      if ((undefined1  [24])((undefined1  [24])pWVar1[lVar7] & (undefined1  [24])0x3f) ==
          (undefined1  [24])0x3) {
        iVar6 = pWVar1[lVar7].End - pWVar1[lVar7].Beg;
        iVar13 = -iVar6;
        if (0 < iVar6) {
          iVar13 = iVar6;
        }
        uVar10 = iVar13 + 1;
        uVar11 = (ulong)uVar10;
        iVar13 = (int)uVar9;
        uVar8 = 0;
        do {
          if ((long)vInv->nSize <= (long)(uVar9 + uVar8)) goto LAB_00302c2f;
        } while ((vInv->pArray[uVar9 + uVar8] == 0) && (uVar8 = uVar8 + 1, uVar11 != uVar8));
        if (uVar10 == (uint)uVar8) {
          uVar9 = (ulong)(uVar10 + iVar13);
        }
        else {
          uVar8 = 0;
          do {
            if (vInv->nSize <= (int)uVar9) {
LAB_00302c2f:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (vInv->pArray[uVar9] != 0) {
              pAVar4 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PI);
              pcVar3 = Wlc_ObjName(pNtk,(int)((ulong)((long)pWVar1 +
                                                     (lVar7 * 0x18 - (long)pNtk->pObjs)) >> 3) *
                                        -0x55555555);
              sprintf(local_13b8,"%s[%d]",pcVar3,uVar8);
              Abc_ObjAssignName(pAVar4,local_13b8,(char *)0x0);
            }
            uVar8 = (ulong)((int)uVar8 + 1);
            uVar9 = uVar9 + 1;
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
          iVar2 = (pNtk->vCis).nSize;
          uVar9 = (ulong)(uVar10 + iVar13);
        }
      }
      iVar13 = (int)uVar9;
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar2);
  }
  if (vInv->nSize != iVar13) {
    __assert_fail("Vec_IntSize(vInv) == nBits",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcAbc.c"
                  ,0x87,"Abc_Ntk_t *Wlc_NtkGetInv(Wlc_Ntk_t *, Vec_Int_t *, Vec_Str_t *, int)");
  }
  pAVar4 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
  pVVar5 = pNtk_00->vPis;
  if (0 < pVVar5->nSize) {
    lVar12 = 0;
    do {
      Abc_ObjAddFanin(pAVar4,(Abc_Obj_t *)pVVar5->pArray[lVar12]);
      lVar12 = lVar12 + 1;
      pVVar5 = pNtk_00->vPis;
    } while (lVar12 < pVVar5->nSize);
  }
  pcVar3 = Abc_SopRegister((Mem_Flex_t *)pNtk_00->pManFunc,vSop->pArray);
  (pAVar4->field_5).pData = pcVar3;
  pObj = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
  Abc_ObjAddFanin(pObj,pAVar4);
  Abc_ObjAssignName(pObj,"inv",(char *)0x0);
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Wlc_NtkGetInv( Wlc_Ntk_t * pNtk, Vec_Int_t * vInv, Vec_Str_t * vSop, int fVerbose )
{
    Wlc_Obj_t * pObj;
    int i, k, nNum, nRange, nBits = 0;
    Abc_Ntk_t * pMainNtk = NULL;
    Abc_Obj_t * pMainObj, * pMainTemp;
    char Buffer[5000];
    // start the network
    pMainNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    // duplicate the name and the spec
    pMainNtk->pName = Extra_UtilStrsav(pNtk->pName);
    // create primary inputs
    Wlc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( pObj->Type != WLC_OBJ_FO )
            continue;
        nRange = Wlc_ObjRange(pObj);
        for ( k = 0; k < nRange; k++ )
        {
            nNum = Vec_IntEntry(vInv, nBits + k);
            if ( nNum )
                break;
        }
        if ( k == nRange )
        {
            nBits += nRange;
            continue;
        }
        //printf( "%s[%d:%d] : ", Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), pObj->End, pObj->Beg );
        for ( k = 0; k < nRange; k++ )
        {
            nNum = Vec_IntEntry( vInv, nBits + k );
            if ( nNum == 0 )
                continue;
            //printf( "  [%d] -> %d", k, nNum );
            pMainObj = Abc_NtkCreatePi( pMainNtk );
            sprintf( Buffer, "%s[%d]", Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), k );
            Abc_ObjAssignName( pMainObj, Buffer, NULL );

        }
        //printf( "\n");
        nBits += nRange;
    }
    //printf( "%d %d\n", Vec_IntSize(vInv), nBits );
    assert( Vec_IntSize(vInv) == nBits );
    // create node
    pMainObj = Abc_NtkCreateNode( pMainNtk );
    Abc_NtkForEachPi( pMainNtk, pMainTemp, i )
        Abc_ObjAddFanin( pMainObj, pMainTemp );
    pMainObj->pData = Abc_SopRegister( (Mem_Flex_t *)pMainNtk->pManFunc, Vec_StrArray(vSop) );
    // create PO
    pMainTemp = Abc_NtkCreatePo( pMainNtk );
    Abc_ObjAddFanin( pMainTemp, pMainObj );
    Abc_ObjAssignName( pMainTemp, "inv", NULL );
    return pMainNtk;
}